

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O0

size_type chain::str::find<(chain::str::case_t)0>
                    (string_view haystack,string_view needle,size_t pos)

{
  size_type sVar1;
  size_t pos_local;
  string_view needle_local;
  string_view haystack_local;
  
  needle_local._M_len = (size_t)needle._M_str;
  needle_local._M_str = (char *)haystack._M_len;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&needle_local._M_str,needle
                     ,pos);
  return sVar1;
}

Assistant:

auto find(std::string_view haystack, std::string_view needle, std::size_t pos = 0) -> std::string_view::size_type
{
    if constexpr (case_type == case_t::sensitive)
    {
        return haystack.find(needle, pos);
    }
    else
    {
        auto it = std::search(
            haystack.begin() + pos, haystack.end(), needle.begin(), needle.end(), equal_uchar<case_t::insensitive>);

        if (it != haystack.end())
        {
            return it - haystack.begin();
        }
        else
        {
            return std::string_view::npos;
        }
    }
}